

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::WithClauseSyntax::setChild(WithClauseSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_004c535c + *(int *)(&DAT_004c535c + index * 4)))();
  return;
}

Assistant:

void WithClauseSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: with = child.token(); return;
        case 1: openParen = child.token(); return;
        case 2: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 3: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}